

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

string * google::protobuf::compiler::python::anon_unknown_0::ModuleName
                   (string *__return_storage_ptr__,string *filename)

{
  bool bVar1;
  char *pcVar2;
  StringPiece x;
  StringPiece y;
  allocator local_59;
  string basename;
  string local_38;
  
  local_38._M_dataplus._M_p = (filename->_M_dataplus)._M_p;
  local_38._M_string_length = filename->_M_string_length;
  if ((long)local_38._M_string_length < 0xb) {
    pcVar2 = ".proto";
  }
  else {
    x = StringPiece::substr((StringPiece *)&local_38,local_38._M_string_length - 0xb,
                            0xffffffffffffffff);
    y.length_ = 0xb;
    y.ptr_ = ".protodevel";
    bVar1 = operator==(x,y);
    pcVar2 = ".proto";
    if (bVar1) {
      pcVar2 = ".protodevel";
    }
  }
  std::__cxx11::string::string((string *)&local_38,pcVar2,&local_59);
  StripSuffixString(&basename,filename,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  ReplaceCharacters(&basename,"-",'_');
  ReplaceCharacters(&basename,"/",'.');
  std::operator+(__return_storage_ptr__,&basename,"_pb2");
  std::__cxx11::string::~string((string *)&basename);
  return __return_storage_ptr__;
}

Assistant:

std::string ModuleName(const std::string& filename) {
  std::string basename = StripProto(filename);
  ReplaceCharacters(&basename, "-", '_');
  ReplaceCharacters(&basename, "/", '.');
  return basename + "_pb2";
}